

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.h
# Opt level: O3

bool __thiscall FIX::TimeRange::isInSameRange(TimeRange *this,DateTime *time1,DateTime *time2)

{
  bool bVar1;
  DateTime local_68;
  DateTime local_50;
  DateTime local_38;
  DateTime local_20;
  
  if ((this->m_startDay & this->m_endDay) < 0) {
    local_20._vptr_DateTime = (_func_int **)&PTR__DateTime_001f5758;
    local_20.m_date = (this->m_startTime).super_DateTime.m_date;
    local_20._12_4_ = *(undefined4 *)&(this->m_startTime).super_DateTime.field_0xc;
    local_20.m_time = (this->m_startTime).super_DateTime.m_time;
    local_38._vptr_DateTime = (_func_int **)&PTR__DateTime_001f5758;
    local_38.m_date = (this->m_endTime).super_DateTime.m_date;
    local_38._12_4_ = *(undefined4 *)&(this->m_endTime).super_DateTime.field_0xc;
    local_38.m_time = (this->m_endTime).super_DateTime.m_time;
    local_50._vptr_DateTime = (_func_int **)&PTR__DateTime_001f5758;
    local_50.m_date = time1->m_date;
    local_50._12_4_ = *(undefined4 *)&time1->field_0xc;
    local_50.m_time = time1->m_time;
    local_68._vptr_DateTime = (_func_int **)&PTR__DateTime_001f5758;
    local_68.m_date = time2->m_date;
    local_68._12_4_ = *(undefined4 *)&time2->field_0xc;
    local_68.m_time = time2->m_time;
    bVar1 = isInSameRange(&local_20,&local_38,&local_50,&local_68);
  }
  else {
    local_20._vptr_DateTime = (_func_int **)&PTR__DateTime_001f5758;
    local_20.m_date = (this->m_startTime).super_DateTime.m_date;
    local_20._12_4_ = *(undefined4 *)&(this->m_startTime).super_DateTime.field_0xc;
    local_20.m_time = (this->m_startTime).super_DateTime.m_time;
    local_38._vptr_DateTime = (_func_int **)&PTR__DateTime_001f5758;
    local_38.m_date = (this->m_endTime).super_DateTime.m_date;
    local_38._12_4_ = *(undefined4 *)&(this->m_endTime).super_DateTime.field_0xc;
    local_38.m_time = (this->m_endTime).super_DateTime.m_time;
    local_50._vptr_DateTime = (_func_int **)&PTR__DateTime_001f5758;
    local_50.m_date = time1->m_date;
    local_50._12_4_ = *(undefined4 *)&time1->field_0xc;
    local_50.m_time = time1->m_time;
    local_68._vptr_DateTime = (_func_int **)&PTR__DateTime_001f5758;
    local_68.m_date = time2->m_date;
    local_68._12_4_ = *(undefined4 *)&time2->field_0xc;
    local_68.m_time = time2->m_time;
    bVar1 = isInSameRange(&local_20,&local_38,this->m_startDay,this->m_endDay,&local_50,&local_68);
  }
  return bVar1;
}

Assistant:

bool isInSameRange(const DateTime &time1, const DateTime &time2) {
    if (m_startDay < 0 && m_endDay < 0) {
      return isInSameRange(m_startTime, m_endTime, time1, time2);
    } else {
      return isInSameRange(m_startTime, m_endTime, m_startDay, m_endDay, time1, time2);
    }
  }